

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyPort.hpp
# Opt level: O2

bool empty_port::impl<(empty_port::Kind)0>::can_listen(port_t port,char *host)

{
  int iVar1;
  bool bVar2;
  SocketHolder sh;
  sockaddr_in addr;
  
  iVar1 = socket(2,1,0);
  SocketHolder::SocketHolder(&sh,iVar1);
  fill_struct(&sh.socket_,&addr,port,host);
  iVar1 = bind(sh.socket_,(sockaddr *)&addr,0x10);
  if (iVar1 < 0) {
    bVar2 = false;
  }
  else {
    iVar1 = listen(sh.socket_,1);
    bVar2 = iVar1 == 0;
  }
  SocketHolder::~SocketHolder(&sh);
  return bVar2;
}

Assistant:

inline bool impl<TCP>::can_listen(const port_t port, const char *host) {
    SocketHolder sh(socket(AF_INET, SOCK_STREAM, 0));
    sockaddr_in addr;
    fill_struct(sh.socket(), addr, port, host);

    if (bind(sh.socket(), (struct sockaddr *)&addr, sizeof(addr)) < 0) {
        return false;
    }
    if (listen(sh.socket(), 1)) {
        return false;
    }

    /* success */
    return true;
}